

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_VariableAccessWorks_Test::~SemanticAnalyserTest_VariableAccessWorks_Test
          (SemanticAnalyserTest_VariableAccessWorks_Test *this)

{
  void *in_RDI;
  
  ~SemanticAnalyserTest_VariableAccessWorks_Test
            ((SemanticAnalyserTest_VariableAccessWorks_Test *)0x1e8cd8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, VariableAccessWorks)
{
  std::string source = R"SRC(
  let global: f32 = 23;
  
  fn main(): f32
  {
    let x: f32 = 2*global;
    let y: f32 = x;
    ret 0;
  }
  )SRC";
  nothrowTest(source);
}